

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

char * mungspaces(char *bp)

{
  bool bVar1;
  char *pcStack_28;
  boolean was_space;
  char *p2;
  char *p;
  char c;
  char *bp_local;
  
  bVar1 = true;
  pcStack_28 = bp;
  for (p2 = bp; p._7_1_ = *p2, p._7_1_ != '\0'; p2 = p2 + 1) {
    if (p._7_1_ == '\t') {
      p._7_1_ = ' ';
    }
    if ((p._7_1_ != ' ') || (!bVar1)) {
      *pcStack_28 = p._7_1_;
      pcStack_28 = pcStack_28 + 1;
    }
    bVar1 = p._7_1_ == ' ';
  }
  if ((bVar1) && (bp < pcStack_28)) {
    pcStack_28 = pcStack_28 + -1;
  }
  *pcStack_28 = '\0';
  return bp;
}

Assistant:

char *mungspaces(char *bp)
{
    char c, *p, *p2;
    boolean was_space = TRUE;

    for (p = p2 = bp; (c = *p) != '\0'; p++) {
	if (c == '\t') c = ' ';
	if (c != ' ' || !was_space) *p2++ = c;
	was_space = (c == ' ');
    }
    if (was_space && p2 > bp) p2--;
    *p2 = '\0';
    return bp;
}